

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O1

int find_keywd(ParseData *lParse,char *keyname,void *itslval)

{
  fitsfile *fptr;
  int iVar1;
  int status;
  char dtype;
  double rval;
  char keyvalue [71];
  int local_88;
  byte local_81;
  double local_80;
  char local_78 [80];
  
  local_88 = 0;
  fptr = lParse->def_fptr;
  iVar1 = ffgkey(fptr,keyname,local_78,(char *)0x0,&local_88);
  if (iVar1 == 0) {
    iVar1 = ffdtyp(local_78,(char *)&local_81,&local_88);
    if (iVar1 == 0) {
      iVar1 = -1;
      switch(local_81) {
      case 0x43:
        ffgkys(fptr,keyname,local_78,(char *)0x0,&local_88);
        strcpy((char *)itslval,local_78);
        iVar1 = 0x105;
        break;
      case 0x46:
        ffgkyd(fptr,keyname,&local_80,(char *)0x0,&local_88);
        *(ulong *)itslval = CONCAT71(local_80._1_7_,local_80._0_1_);
        iVar1 = 0x104;
        break;
      case 0x49:
        ffgkyj(fptr,keyname,(long *)&local_80,(char *)0x0,&local_88);
        *(ulong *)itslval = CONCAT71(local_80._1_7_,local_80._0_1_);
        iVar1 = 0x103;
        break;
      case 0x4c:
        ffgkyl(fptr,keyname,(int *)&local_80,(char *)0x0,&local_88);
        *(undefined1 *)itslval = local_80._0_1_;
        iVar1 = 0x102;
      }
      if (local_88 == 0) {
        return iVar1;
      }
    }
  }
  else if (local_88 == 0xca) {
    snprintf(local_78,0x47,"ffgkey could not find keyword: %s",keyname);
    ffpmsg(local_78);
  }
  lParse->status = local_88;
  return -1;
}

Assistant:

static int find_keywd(ParseData *lParse, char *keyname, void *itslval )
{
   FITS_PARSER_YYSTYPE *thelval = (FITS_PARSER_YYSTYPE*)itslval;
   int status, type;
   char keyvalue[FLEN_VALUE], dtype;
   fitsfile *fptr;
   double rval;
   int bval;
   long ival;

   status = 0;
   fptr = lParse->def_fptr;
   if( fits_read_keyword( fptr, keyname, keyvalue, NULL, &status ) ) {
      if( status == KEY_NO_EXIST ) {
         /*  Do this since ffgkey doesn't put an error message on stack  */
         snprintf(keyvalue,FLEN_VALUE, "ffgkey could not find keyword: %s",keyname);
         ffpmsg(keyvalue);
      }
      lParse->status = status;
      return( pERROR );
   }
      
   if( fits_get_keytype( keyvalue, &dtype, &status ) ) {
      lParse->status = status;
      return( pERROR );
   }

   /* Read appropriate value type and set to CONST_OP */
   switch( dtype ) {
   case 'C':
      fits_read_key_str( fptr, keyname, keyvalue, NULL, &status );
      type = STRING;
      strcpy( thelval->str , keyvalue );
      break;
   case 'L':
      fits_read_key_log( fptr, keyname, &bval, NULL, &status );
      type = BOOLEAN;
      thelval->log = bval;
      break;
   case 'I':
      fits_read_key_lng( fptr, keyname, &ival, NULL, &status );
      type = LONG;
      thelval->lng = ival;
      break;
   case 'F':
      fits_read_key_dbl( fptr, keyname, &rval, NULL, &status );
      type = DOUBLE;
      thelval->dbl = rval;
      break;
   default:
      type = pERROR;
      break;
   }

   if( status ) {
      lParse->status=status;
      return pERROR;
   }

   return( type );
}